

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_>::vector
          (vector<pbrt::Point2<float>,_pstd::pmr::polymorphic_allocator<pbrt::Point2<float>_>_>
           *this,size_t count,Point2<float> *value,
          polymorphic_allocator<pbrt::Point2<float>_> *alloc)

{
  size_t i;
  size_t sVar1;
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->nStored = 0;
  this->ptr = (Point2<float> *)0x0;
  this->nAlloc = 0;
  reserve(this,count);
  for (sVar1 = 0; count != sVar1; sVar1 = sVar1 + 1) {
    this->ptr[sVar1].super_Tuple2<pbrt::Point2,_float> = value->super_Tuple2<pbrt::Point2,_float>;
  }
  this->nStored = count;
  return;
}

Assistant:

vector(size_t count, const T &value, const Allocator &alloc = {}) : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(ptr + i, value);
        nStored = count;
    }